

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::ValidateMemOpCandidates
          (GlobOpt *this,Loop *loop,MemOpEmitData **inOrderEmitData,int *iEmitData)

{
  BasicBlock *this_00;
  code *pcVar1;
  BasicBlock *this_01;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type *ppBVar6;
  Instr *pIVar7;
  Type_conflict node;
  Type *ppMVar8;
  JitArenaAllocator *pJVar9;
  JITTimeFunctionBody *pJVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  int iVar13;
  bool local_341;
  Instr *local_298;
  Instr *__instr___3;
  char16 debugStringBuffer_3 [42];
  bool local_219;
  bool candidateFound;
  code *pcStack_218;
  bool errorInInstr;
  undefined8 local_210;
  TrackAllocData local_208;
  undefined8 local_1e0;
  Instr *__instr___2;
  char16 debugStringBuffer_2 [42];
  MemCopyCandidate *memcopyCandidate;
  TrackAllocData local_168;
  undefined8 local_140;
  Instr *__instr___1;
  char16 debugStringBuffer_1 [42];
  Instr *__instr__;
  char16 debugStringBuffer [42];
  InductionVariableChangeInfo inductionVariableChangeInfo;
  Instr *instr;
  Instr *instrStop;
  Instr *__nextInstrCheck;
  MemOpEmitData *emitData;
  MemOpCandidate *candidate;
  BasicBlock *bblock;
  Iterator iter;
  int *iEmitData_local;
  MemOpEmitData **inOrderEmitData_local;
  Loop *loop_local;
  GlobOpt *this_local;
  
  uVar4 = *iEmitData;
  iter.current = (NodeBase *)iEmitData;
  uVar3 = RealCount::Count(&(loop->memOpInfo->candidates->
                            super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
                            super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>
                            .super_RealCount);
  if (uVar4 != uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ab,"(iEmitData == (int)loop->memOpInfo->candidates->Count())",
                       "iEmitData == (int)loop->memOpInfo->candidates->Count()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::HasTwo
                    (&(loop->blockList).
                      super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ad,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)&bblock,
             (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
             loop->memOpInfo->candidates);
  ppBVar6 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&(loop->blockList).
                        super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>);
  this_00 = (*ppBVar6)->next;
  emitData = (MemOpEmitData *)0x0;
  __nextInstrCheck = (Instr *)0x0;
  instrStop = (Instr *)0x0;
  pIVar7 = BasicBlock::GetFirstInstr(this_00);
  if (pIVar7 == (Instr *)0x0) {
    local_298 = (Instr *)0x0;
  }
  else {
    pIVar7 = BasicBlock::GetFirstInstr(this_00);
    local_298 = pIVar7->m_prev;
  }
  register0x00000000 = BasicBlock::GetLastInstr(this_00);
  do {
    if (stack0xffffffffffffff80 == local_298) {
LAB_005b751c:
      bVar2 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
              IsValid((Iterator *)&bblock);
      if (!bVar2) {
        return true;
      }
      uVar4 = Func::GetSourceContextId(this->func);
      uVar3 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar3);
      if (!bVar2) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar3 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar3);
        if (!bVar2) {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar3 = Func::GetLocalFunctionId(this->func);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar3);
          if (!bVar2) {
            return false;
          }
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar10 = Func::GetJITFunctionBody(this->func);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
      pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___3);
      uVar4 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar11,pcVar12,(ulong)uVar4);
      Output::Print(L"Candidates not found in loop while validating");
      Output::Print(L"\n");
      Output::Flush();
      return false;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_prev != stack0xffffffffffffff80)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x44b5,
                         "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    instrStop = stack0xffffffffffffff80;
    if (emitData == (MemOpEmitData *)0x0) {
      if (iter.list == (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_01 = bblock;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                         this_01,node);
      if (bVar2) {
        iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        goto LAB_005b751c;
      }
      iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                  SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppMVar8 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&bblock);
      emitData = (MemOpEmitData *)*ppMVar8;
      if (emitData != (MemOpEmitData *)0x0) {
        memset((void *)((long)debugStringBuffer + 0x4f),0,1);
        bVar2 = JsUtil::
                BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetValue<unsigned_int>
                          (loop->memOpInfo->inductionVariableChangeInfoMap,
                           (SymID *)((long)&emitData->candidate + 4),
                           (InductionVariableChangeInfo *)((long)debugStringBuffer + 0x4f));
        if (!bVar2) {
          if ((DAT_01ec73ca & 1) != 0) {
            uVar4 = Func::GetSourceContextId(this->func);
            uVar3 = Func::GetLocalFunctionId(this->func);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar3);
            if (!bVar2) {
              uVar4 = Func::GetSourceContextId(this->func);
              uVar3 = Func::GetLocalFunctionId(this->func);
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar3);
              if (!bVar2) {
                uVar4 = Func::GetSourceContextId(this->func);
                uVar3 = Func::GetLocalFunctionId(this->func);
                bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar3);
                if (!bVar2) {
                  return false;
                }
              }
            }
            Output::Print(L"TRACE MemOp:");
            pJVar10 = Func::GetJITFunctionBody(this->func);
            pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
            pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr__);
            uVar4 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar11,pcVar12,(ulong)uVar4);
            Output::Print(L"MemOp skipped (s%d): no induction variable",
                          (ulong)*(uint *)&emitData->candidate);
            stack0xffffffffffffff20 = 0;
            Output::Print(L"\n");
            Output::Flush();
          }
          return false;
        }
        if ((debugStringBuffer[0x27]._1_1_ & 0x7f) != *(byte *)&emitData->stElemInstr) {
          if ((DAT_01ec73ca & 1) != 0) {
            uVar4 = Func::GetSourceContextId(this->func);
            uVar3 = Func::GetLocalFunctionId(this->func);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar3);
            if (!bVar2) {
              uVar4 = Func::GetSourceContextId(this->func);
              uVar3 = Func::GetLocalFunctionId(this->func);
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar3);
              if (!bVar2) {
                uVar4 = Func::GetSourceContextId(this->func);
                uVar3 = Func::GetLocalFunctionId(this->func);
                bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar3);
                if (!bVar2) {
                  return false;
                }
              }
            }
            Output::Print(L"TRACE MemOp:");
            pJVar10 = Func::GetJITFunctionBody(this->func);
            pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
            pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___1);
            uVar4 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar11,pcVar12,(ulong)uVar4);
            Output::Print(L"MemOp skipped (s%d): not matching unroll count",
                          (ulong)*(uint *)&emitData->candidate);
            local_140 = 0;
            Output::Print(L"\n");
            Output::Flush();
          }
          return false;
        }
        bVar2 = Loop::MemOpCandidate::IsMemSet((MemOpCandidate *)emitData);
        if (bVar2) {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar3 = Func::GetLocalFunctionId(this->func);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemSetPhase,uVar4,uVar3);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x44d7,
                               "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemSetPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                               ,"!PHASE_OFF(Js::MemSetPhase, this->func)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          pJVar9 = this->alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_168,(type_info *)&MemSetEmitData::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x44d8);
          pJVar9 = (JitArenaAllocator *)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pJVar9,&local_168);
          __nextInstrCheck = (Instr *)new<Memory::JitArenaAllocator>(0x20,pJVar9,0x4e98c0);
          memset(__nextInstrCheck,0,0x20);
        }
        else {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar3 = Func::GetLocalFunctionId(this->func);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemCopyPhase,uVar4,uVar3);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x44dc,
                               "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemCopyPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                               ,"!PHASE_OFF(Js::MemCopyPhase, this->func)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          bVar2 = Loop::MemOpCandidate::IsMemCopy((MemOpCandidate *)emitData);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x44de,"(candidate->IsMemCopy())","candidate->IsMemCopy()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          register0x00000000 = Loop::MemOpCandidate::AsMemCopy((MemOpCandidate *)emitData);
          if ((((register0x00000000->super_MemOpCandidate).base == 0xffffffff) ||
              (register0x00000000->ldBase == 0xffffffff)) ||
             (register0x00000000->ldCount != (register0x00000000->super_MemOpCandidate).count)) {
            uVar4 = Func::GetSourceContextId(this->func);
            uVar3 = Func::GetLocalFunctionId(this->func);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar3);
            if (!bVar2) {
              uVar4 = Func::GetSourceContextId(this->func);
              uVar3 = Func::GetLocalFunctionId(this->func);
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar3);
              if (!bVar2) {
                return false;
              }
            }
            Output::Print(L"TRACE MemCopy:");
            pJVar10 = Func::GetJITFunctionBody(this->func);
            pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
            pcVar12 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___2);
            uVar4 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar11,pcVar12,(ulong)uVar4);
            Output::Print(L"(s%d): not matching ldElem and stElem",
                          (ulong)*(uint *)&emitData->candidate);
            local_1e0 = 0;
            Output::Print(L"\n");
            Output::Flush();
            return false;
          }
          pJVar9 = this->alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_208,(type_info *)&MemCopyEmitData::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x44e8);
          pJVar9 = (JitArenaAllocator *)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pJVar9,&local_208);
          pcStack_218 = Memory::JitArenaAllocator::Alloc;
          local_210 = 0;
          __nextInstrCheck = (Instr *)new<Memory::JitArenaAllocator>(0x28,pJVar9,0x4e98c0);
          memset(__nextInstrCheck,0,0x28);
        }
        if (__nextInstrCheck == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x44ea,"(emitData)","emitData");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        __nextInstrCheck->m_next = (Instr *)this_00;
        *(byte *)&__nextInstrCheck->m_prev = debugStringBuffer[0x27]._1_1_;
        __nextInstrCheck->_vptr_Instr = (_func_int **)emitData;
        goto LAB_005b73b6;
      }
    }
    else {
LAB_005b73b6:
      local_219 = false;
      bVar2 = Loop::MemOpCandidate::IsMemSet((MemOpCandidate *)emitData);
      if (bVar2) {
        local_341 = InspectInstrForMemSetCandidate
                              (this,loop,stack0xffffffffffffff80,(MemSetEmitData *)__nextInstrCheck,
                               &local_219);
      }
      else {
        local_341 = InspectInstrForMemCopyCandidate
                              (this,loop,stack0xffffffffffffff80,(MemCopyEmitData *)__nextInstrCheck
                               ,&local_219);
      }
      if ((local_219 & 1U) != 0) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,MemOpEmitData>
                  (this->alloc,(MemOpEmitData *)__nextInstrCheck);
        return false;
      }
      if (local_341 != false) {
        if (*(int *)&(iter.current)->next < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x44fa,"(iEmitData > 0)","iEmitData > 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        if (*(int *)&(iter.current)->next == 0) goto LAB_005b751c;
        iVar13 = *(int *)&(iter.current)->next + -1;
        *(int *)&(iter.current)->next = iVar13;
        inOrderEmitData[iVar13] = (MemOpEmitData *)__nextInstrCheck;
        emitData = (MemOpEmitData *)0x0;
        __nextInstrCheck = (Instr *)0x0;
      }
    }
    unique0x00012000 = stack0xffffffffffffff80->m_prev;
  } while( true );
}

Assistant:

bool
GlobOpt::ValidateMemOpCandidates(Loop * loop, _Out_writes_(iEmitData) MemOpEmitData** inOrderEmitData, int& iEmitData)
{
    AnalysisAssert(iEmitData == (int)loop->memOpInfo->candidates->Count());
    // We iterate over the second block of the loop only. MemOp Works only if the loop has exactly 2 blocks
    Assert(loop->blockList.HasTwo());

    Loop::MemOpList::Iterator iter(loop->memOpInfo->candidates);
    BasicBlock* bblock = loop->blockList.Head()->next;
    Loop::MemOpCandidate* candidate = nullptr;
    MemOpEmitData* emitData = nullptr;

    // Iterate backward because the list of candidate is reversed
    FOREACH_INSTR_BACKWARD_IN_BLOCK(instr, bblock)
    {
        if (!candidate)
        {
            // Time to check next candidate
            if (!iter.Next())
            {
                // We have been through the whole list of candidates, finish
                break;
            }
            candidate = iter.Data();
            if (!candidate)
            {
                continue;
            }

            // Common check for memset and memcopy
            Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };

            // Get the inductionVariable changeInfo
            if (!loop->memOpInfo->inductionVariableChangeInfoMap->TryGetValue(candidate->index, &inductionVariableChangeInfo))
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): no induction variable"), candidate->base);
                return false;
            }

            if (inductionVariableChangeInfo.unroll != candidate->count)
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): not matching unroll count"), candidate->base);
                return false;
            }

            if (candidate->IsMemSet())
            {
                Assert(!PHASE_OFF(Js::MemSetPhase, this->func));
                emitData = JitAnew(this->alloc, MemSetEmitData);
            }
            else
            {
                Assert(!PHASE_OFF(Js::MemCopyPhase, this->func));
                // Specific check for memcopy
                Assert(candidate->IsMemCopy());
                Loop::MemCopyCandidate* memcopyCandidate = candidate->AsMemCopy();

                if (memcopyCandidate->base == Js::Constants::InvalidSymID
                    || memcopyCandidate->ldBase == Js::Constants::InvalidSymID
                    || (memcopyCandidate->ldCount != memcopyCandidate->count))
                {
                    TRACE_MEMOP_PHASE(MemCopy, loop, nullptr, _u("(s%d): not matching ldElem and stElem"), candidate->base);
                    return false;
                }
                emitData = JitAnew(this->alloc, MemCopyEmitData);
            }
            Assert(emitData);
            emitData->block = bblock;
            emitData->inductionVar = inductionVariableChangeInfo;
            emitData->candidate = candidate;
        }
        bool errorInInstr = false;
        bool candidateFound = candidate->IsMemSet() ?
            InspectInstrForMemSetCandidate(loop, instr, (MemSetEmitData*)emitData, errorInInstr)
            : InspectInstrForMemCopyCandidate(loop, instr, (MemCopyEmitData*)emitData, errorInInstr);
        if (errorInInstr)
        {
            JitAdelete(this->alloc, emitData);
            return false;
        }
        if (candidateFound)
        {
            AnalysisAssert(iEmitData > 0);
            if (iEmitData == 0)
            {
                // Explicit for OACR
                break;
            }
            inOrderEmitData[--iEmitData] = emitData;
            candidate = nullptr;
            emitData = nullptr;

        }
    } NEXT_INSTR_BACKWARD_IN_BLOCK;

    if (iter.IsValid())
    {
        TRACE_MEMOP(loop, nullptr, _u("Candidates not found in loop while validating"));
        return false;
    }
    return true;
}